

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
resize(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      size_t new_size)

{
  unit_t *puVar1;
  uchar *puVar2;
  size_t in_RSI;
  undefined8 *in_RDI;
  size_t unaff_retaddr;
  unit_t *in_stack_00000008;
  unit_t tmp;
  undefined8 *puVar3;
  
  puVar3 = in_RDI;
  puVar1 = _resize<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::unit_t>
                     (in_stack_00000008,unaff_retaddr,(size_t)in_RDI,tmp);
  *in_RDI = puVar1;
  puVar2 = _resize<unsigned_char>
                     ((uchar *)tmp,(size_t)in_stack_00000008,unaff_retaddr,
                      (uchar)((ulong)puVar3 >> 0x38));
  in_RDI[1] = puVar2;
  in_RDI[3] = in_RSI;
  return in_RSI;
}

Assistant:

size_t resize(const size_t new_size) {
    unit_t tmp;
    tmp.base = 0;
    tmp.check = 0;
    array_ = _resize(array_, alloc_size_, new_size, tmp);
    used_  = _resize(used_, alloc_size_, new_size,
                     static_cast<unsigned char>(0));
    alloc_size_ = new_size;
    return new_size;
  }